

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listReporters(Config *param_1)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
  *this;
  const_iterator cVar6;
  unsigned_long *puVar7;
  pointer ppVar8;
  IReporterFactory *pIVar9;
  TextAttributes *pTVar10;
  long lVar11;
  size_type sVar12;
  allocator local_f9;
  string local_f8 [48];
  TextAttributes local_c8;
  string local_b0;
  undefined1 local_90 [8];
  Text wrapper;
  unsigned_long local_38;
  size_t maxNameLen;
  const_iterator it;
  const_iterator itEnd;
  const_iterator itBegin;
  FactoryMap *factories;
  Config *param_0_local;
  
  poVar4 = cout();
  std::operator<<(poVar4,"Available reporters:\n");
  pIVar5 = getRegistryHub();
  iVar3 = (*pIVar5->_vptr_IRegistryHub[2])();
  this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
          *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))();
  cVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
          ::begin(this);
  it = std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
       ::end(this);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
              *)&maxNameLen);
  local_38 = 0;
  maxNameLen = (size_t)cVar6;
  while (bVar2 = std::operator!=((_Self *)&maxNameLen,&it), bVar2) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                  *)&maxNameLen);
    wrapper.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::size();
    puVar7 = std::max<unsigned_long>
                       (&local_38,
                        (unsigned_long *)
                        &wrapper.lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_38 = *puVar7;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                  *)&maxNameLen);
  }
  while (maxNameLen = (size_t)cVar6._M_node, bVar2 = std::operator!=((_Self *)&maxNameLen,&it),
        bVar2) {
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                           *)&maxNameLen);
    pIVar9 = Ptr<Catch::IReporterFactory>::operator->(&ppVar8->second);
    (*(pIVar9->super_IShared).super_NonCopyable._vptr_NonCopyable[5])(&local_b0);
    Tbc::TextAttributes::TextAttributes(&local_c8);
    pTVar10 = Tbc::TextAttributes::setInitialIndent(&local_c8,0);
    pTVar10 = Tbc::TextAttributes::setIndent(pTVar10,local_38 + 7);
    pTVar10 = Tbc::TextAttributes::setWidth(pTVar10,0x48 - local_38);
    Tbc::Text::Text((Text *)local_90,&local_b0,pTVar10);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar4 = cout();
    poVar4 = std::operator<<(poVar4,"  ");
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                           *)&maxNameLen);
    poVar4 = std::operator<<(poVar4,(string *)ppVar8);
    poVar4 = std::operator<<(poVar4,':');
    uVar1 = local_38;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                  *)&maxNameLen);
    lVar11 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,(uVar1 - lVar11) + 2,' ',&local_f9);
    poVar4 = std::operator<<(poVar4,local_f8);
    poVar4 = Tbc::operator<<(poVar4,(Text *)local_90);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    Tbc::Text::~Text((Text *)local_90);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>
                  *)&maxNameLen);
    cVar6._M_node = (_Base_ptr)maxNameLen;
  }
  poVar4 = cout();
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
           ::size(this);
  return sVar12;
}

Assistant:

inline std::size_t listReporters( Config const& /*config*/ ) {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        IReporterRegistry::FactoryMap::const_iterator itBegin = factories.begin(), itEnd = factories.end(), it;
        std::size_t maxNameLen = 0;
        for(it = itBegin; it != itEnd; ++it )
            maxNameLen = (std::max)( maxNameLen, it->first.size() );

        for(it = itBegin; it != itEnd; ++it ) {
            Text wrapper( it->second->getDescription(), TextAttributes()
                                                        .setInitialIndent( 0 )
                                                        .setIndent( 7+maxNameLen )
                                                        .setWidth( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 ) );
            Catch::cout() << "  "
                    << it->first
                    << ':'
                    << std::string( maxNameLen - it->first.size() + 2, ' ' )
                    << wrapper << '\n';
        }
        Catch::cout() << std::endl;
        return factories.size();
    }